

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3TermCmp(char *zLhs,int nLhs,char *zRhs,int nRhs)

{
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  void *in_RDI;
  int res;
  int nCmp;
  int local_28;
  int local_24;
  
  local_28 = in_ECX;
  if (in_ESI < in_ECX) {
    local_28 = in_ESI;
  }
  if (((local_28 == 0) || (in_RDI == (void *)0x0)) || (in_RDX == (void *)0x0)) {
    local_24 = 0;
  }
  else {
    local_24 = memcmp(in_RDI,in_RDX,(long)local_28);
  }
  if (local_24 == 0) {
    local_24 = in_ESI - in_ECX;
  }
  return local_24;
}

Assistant:

static int fts3TermCmp(
  const char *zLhs, int nLhs,     /* LHS of comparison */
  const char *zRhs, int nRhs      /* RHS of comparison */
){
  int nCmp = MIN(nLhs, nRhs);
  int res;

  if( nCmp && ALWAYS(zLhs) && ALWAYS(zRhs) ){
    res = memcmp(zLhs, zRhs, nCmp);
  }else{
    res = 0;
  }
  if( res==0 ) res = nLhs - nRhs;

  return res;
}